

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

char * sam_hdr_PG_ID(SAM_hdr *sh,char *name)

{
  khint_t kVar1;
  uint uVar2;
  kh_m_s2i_t *pkVar3;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  khint_t kVar12;
  uint uVar13;
  char *pcVar14;
  
  pkVar3 = sh->pg_hash;
  kVar1 = pkVar3->n_buckets;
  pcVar14 = name;
  if (kVar1 == 0) {
    uVar13 = 0;
LAB_00139edd:
    if (uVar13 != kVar1) {
      pcVar14 = sh->ID_buf;
      do {
        sh->ID_cnt = sh->ID_cnt + 1;
        sprintf(pcVar14,"%.1000s.%d",name);
        pkVar3 = sh->pg_hash;
        kVar1 = pkVar3->n_buckets;
        kVar12 = 0;
        if (kVar1 != 0) {
          uVar13 = (uint)*pcVar14;
          if (*pcVar14 == '\0') {
            uVar13 = 0;
          }
          else {
            cVar5 = sh->ID_buf[1];
            pcVar9 = sh->ID_buf + 2;
            while (cVar5 != '\0') {
              uVar13 = (int)cVar5 + uVar13 * 0x1f;
              cVar5 = *pcVar9;
              pcVar9 = pcVar9 + 1;
            }
          }
          uVar13 = uVar13 & kVar1 - 1;
          pkVar4 = pkVar3->flags;
          iVar11 = 1;
          uVar10 = uVar13;
          do {
            uVar2 = pkVar4[uVar10 >> 4];
            bVar8 = (char)uVar10 * '\x02' & 0x1e;
            uVar6 = uVar2 >> bVar8;
            if (((uVar6 & 2) != 0) ||
               (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar10],pcVar14), iVar7 == 0)))) {
              kVar12 = uVar10;
              if ((uVar2 >> bVar8 & 3) != 0) {
                kVar12 = kVar1;
              }
              break;
            }
            uVar10 = uVar10 + iVar11 & kVar1 - 1;
            iVar11 = iVar11 + 1;
            kVar12 = kVar1;
          } while (uVar10 != uVar13);
        }
      } while (kVar12 == kVar1);
    }
  }
  else {
    uVar10 = (uint)*name;
    if (*name == '\0') {
      uVar10 = 0;
    }
    else {
      cVar5 = name[1];
      if (cVar5 != '\0') {
        pcVar9 = name + 2;
        do {
          uVar10 = (int)cVar5 + uVar10 * 0x1f;
          cVar5 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar5 != '\0');
      }
    }
    uVar10 = uVar10 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar11 = 1;
    uVar13 = uVar10;
    do {
      uVar2 = pkVar4[uVar13 >> 4];
      bVar8 = (char)uVar13 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar8;
      if (((uVar6 & 2) != 0) ||
         (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar13],name), iVar7 == 0)))) {
        if ((uVar2 >> bVar8 & 3) != 0) {
          uVar13 = kVar1;
        }
        goto LAB_00139edd;
      }
      uVar13 = uVar13 + iVar11 & kVar1 - 1;
      iVar11 = iVar11 + 1;
    } while (uVar13 != uVar10);
  }
  return pcVar14;
}

Assistant:

const char *sam_hdr_PG_ID(SAM_hdr *sh, const char *name) {
    khint_t k = kh_get(m_s2i, sh->pg_hash, name);
    if (k == kh_end(sh->pg_hash))
	return name;

    do {
	sprintf(sh->ID_buf, "%.1000s.%d", name, sh->ID_cnt++);
	k = kh_get(m_s2i, sh->pg_hash, sh->ID_buf);
    } while (k == kh_end(sh->pg_hash));

    return sh->ID_buf;
}